

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O2

CommandOptions * read_PCM_file(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  Rational *edit_rate;
  uint uVar1;
  MDD_t MVar2;
  uint uVar3;
  long *plVar4;
  undefined8 uVar5;
  AudioDescriptor *d;
  AESDecContext *this;
  HMACContext *this_00;
  long lVar6;
  Rational RVar7;
  IFileReaderFactory *in_RDX;
  ui32_t duration_samples;
  uint uVar8;
  uint uVar9;
  char *__ptr;
  size_t sStack_340;
  MXFReader Reader;
  Result_t *local_310;
  FrameBuffer FrameBuffer;
  Result_t result;
  WriterInfo Info;
  InterchangeObject *tmp_obj;
  undefined8 uStack_1c0;
  uint local_1a0;
  WavFileWriter OutWave;
  undefined1 local_100 [208];
  
  AS_02::PCM::MXFReader::MXFReader(&Reader,in_RDX);
  ASDCP::PCM::FrameBuffer::FrameBuffer(&FrameBuffer);
  OutWave.m_OutFile.super__List_base<WavFileElement_*,_std::allocator<WavFileElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&OutWave.m_OutFile;
  OutWave.m_ADesc.EditRate.Numerator = 0;
  OutWave.m_ADesc.EditRate.Denominator = 0;
  OutWave.m_ADesc.AudioSamplingRate.Numerator = 0;
  OutWave.m_ADesc.AudioSamplingRate.Denominator = 0;
  OutWave.m_OutFile.super__List_base<WavFileElement_*,_std::allocator<WavFileElement_*>_>._M_impl.
  _M_node._M_size = 0;
  OutWave.m_ChannelCount = 0;
  edit_rate = (Rational *)(fileReaderFactory + 5);
  if (*(int *)((long)&fileReaderFactory[5]._vptr_IFileReaderFactory + 4) == 0 &&
      *(int *)&fileReaderFactory[5]._vptr_IFileReaderFactory == 0) {
    *edit_rate = ASDCP::EditRate_24;
  }
  OutWave.m_OutFile.super__List_base<WavFileElement_*,_std::allocator<WavFileElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       OutWave.m_OutFile.super__List_base<WavFileElement_*,_std::allocator<WavFileElement_*>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&Info,(char *)fileReaderFactory[0xb]._vptr_IFileReaderFactory,
             (allocator<char> *)&tmp_obj);
  local_310 = &result;
  AS_02::PCM::MXFReader::OpenRead((string *)local_310,(Rational *)&Reader);
  std::__cxx11::string::~string((string *)&Info);
  if (_result < 0) {
LAB_00109285:
    uVar3 = 0;
LAB_00109293:
    for (uVar9 = *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
        (-1 < _result && (uVar9 < uVar3)); uVar9 = uVar9 + 1) {
      AS_02::PCM::MXFReader::ReadFrame
                ((uint)&Info,(FrameBuffer *)&Reader,(AESDecContext *)(ulong)uVar9,
                 (HMACContext *)&FrameBuffer);
      Kumu::Result_t::operator=(&result,(Result_t *)&Info);
      Kumu::Result_t::~Result_t((Result_t *)&Info);
      if (-1 < _result) {
        if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
          FrameBuffer._28_4_ = uVar9;
          ASDCP::PCM::FrameBuffer::Dump((_IO_FILE *)&FrameBuffer,(uint)_stderr);
        }
        if (FrameBuffer._24_4_ != FrameBuffer._16_4_) {
          fwrite("Last frame is incomplete, padding with zeros.\n",0x2e,1,_stderr);
          FrameBuffer._24_4_ = FrameBuffer._16_4_;
        }
        WavFileWriter::WriteFrame((WavFileWriter *)&Info,(FrameBuffer *)&OutWave);
        Kumu::Result_t::operator=(&result,(Result_t *)&Info);
        Kumu::Result_t::~Result_t((Result_t *)&Info);
      }
    }
  }
  else {
    if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
      fprintf(_stderr,"Frame Buffer size: %u\n",
              (ulong)*(uint *)((long)&fileReaderFactory[4]._vptr_IFileReaderFactory + 4));
    }
    tmp_obj = (InterchangeObject *)0x0;
    plVar4 = (long *)AS_02::PCM::MXFReader::OP1aHeader();
    MVar2 = ASDCP::DefaultCompositeDict();
    uVar5 = ASDCP::Dictionary::Type(MVar2);
    (**(code **)(*plVar4 + 0xa8))(&Info,plVar4,uVar5,&tmp_obj);
    Kumu::Result_t::operator=(&result,(Result_t *)&Info);
    Kumu::Result_t::~Result_t((Result_t *)&Info);
    if (_result < 0) goto LAB_00109285;
    if ((tmp_obj == (InterchangeObject *)0x0) ||
       (d = (AudioDescriptor *)
            __dynamic_cast(tmp_obj,&ASDCP::MXF::InterchangeObject::typeinfo,
                           &ASDCP::MXF::WaveAudioDescriptor::typeinfo,0),
       d == (AudioDescriptor *)0x0)) {
      __ptr = "File does not contain an essence descriptor.\n";
      sStack_340 = 0x2d;
LAB_00109393:
      fwrite(__ptr,sStack_340,1,_stderr);
      Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)&Kumu::RESULT_FAIL);
      goto LAB_00109516;
    }
    if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
      (**(code **)((long)d->EditRate + 0x88))(d,0);
    }
    RVar7 = d[5].AudioSamplingRate;
    if (RVar7 == (Rational)0x0) {
      fwrite("ContainerDuration not set in file descriptor, attempting to use index duration.\n",
             0x50,1,_stderr);
      AS_02::PCM::MXFReader::AS02IndexReader();
      RVar7 = (Rational)AS_02::MXF::AS02IndexReader::GetDuration();
LAB_0010904b:
      duration_samples = RVar7.Numerator;
      if (duration_samples == 0) goto LAB_001093b7;
    }
    else {
      if ((char)d[5].Locked == '\x01') goto LAB_0010904b;
LAB_001093b7:
      fwrite("ContainerDuration not set in index, attempting to use Duration from SourceClip.\n",
             0x50,1,_stderr);
      plVar4 = (long *)AS_02::PCM::MXFReader::OP1aHeader();
      MVar2 = ASDCP::DefaultCompositeDict();
      uVar5 = ASDCP::Dictionary::Type(MVar2);
      (**(code **)(*plVar4 + 0xa8))(&Info,plVar4,uVar5,&tmp_obj);
      Kumu::Result_t::operator=(&result,(Result_t *)&Info);
      Kumu::Result_t::~Result_t((Result_t *)&Info);
      if (((_result < 0) ||
          (lVar6 = __dynamic_cast(tmp_obj,&ASDCP::MXF::InterchangeObject::typeinfo,
                                  &ASDCP::MXF::SourceClip::typeinfo,0),
          *(char *)(lVar6 + 200) == '\0')) ||
         (duration_samples = *(ui32_t *)(lVar6 + 0xc0), duration_samples == 0)) {
        __ptr = "Unable to determine file duration.\n";
        sStack_340 = 0x23;
        goto LAB_00109393;
      }
    }
    AS_02::MXF::CalcFrameBufferSize((WaveAudioDescriptor *)d,edit_rate);
    ASDCP::FrameBuffer::Capacity((int)local_100 + 0x68);
    Kumu::Result_t::~Result_t((Result_t *)(local_100 + 0x68));
    uVar3 = AS_02::MXF::CalcFramesFromDurationInSamples
                      (duration_samples,(WaveAudioDescriptor *)d,edit_rate);
    if (_result < 0) goto LAB_00109293;
    uVar9 = *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
    uVar1 = *(uint *)&fileReaderFactory[3]._vptr_IFileReaderFactory;
    uVar8 = uVar3;
    if (uVar1 < uVar3) {
      uVar8 = uVar1;
    }
    if (uVar1 == 0) {
      uVar8 = uVar3;
    }
    if (uVar9 == 0) {
LAB_001090bf:
      tmp_obj = (InterchangeObject *)0x0;
      uStack_1c0 = 0;
      ASDCP::MD_to_PCM_ADesc((WaveAudioDescriptor *)&Info,d);
      Kumu::Result_t::operator=(&result,(Result_t *)&Info);
      uVar3 = uVar8 - uVar9;
      Kumu::Result_t::~Result_t((Result_t *)&Info);
      if (-1 < _result) {
        tmp_obj = (InterchangeObject *)fileReaderFactory[5]._vptr_IFileReaderFactory;
        local_1a0 = uVar3;
        WavFileWriter::OpenWrite
                  ((WavFileWriter *)&Info,&OutWave.m_ADesc,(char *)&tmp_obj,
                   (SplitType_t)fileReaderFactory[6]._vptr_IFileReaderFactory);
        Kumu::Result_t::operator=(&result,(Result_t *)&Info);
        Kumu::Result_t::~Result_t((Result_t *)&Info);
        if ((-1 < _result) &&
           (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 1) == '\x01')) {
          this = (AESDecContext *)operator_new(8);
          ASDCP::AESDecContext::AESDecContext(this);
          ASDCP::AESDecContext::InitKey(Info.ProductUUID);
          Kumu::Result_t::operator=(&result,(Result_t *)&Info);
          Kumu::Result_t::~Result_t((Result_t *)&Info);
          if ((-1 < _result) &&
             (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 2) == '\x01')) {
            ASDCP::WriterInfo::WriterInfo(&Info);
            AS_02::PCM::MXFReader::FillWriterInfo((WriterInfo *)local_100);
            Kumu::Result_t::~Result_t((Result_t *)local_100);
            if (Info.UsesHMAC == true) {
              this_00 = (HMACContext *)operator_new(8);
              ASDCP::HMACContext::HMACContext(this_00);
              ASDCP::HMACContext::InitKey((uchar *)&tmp_obj,(LabelSet_t)this_00);
              Kumu::Result_t::operator=(&result,(Result_t *)&tmp_obj);
              Kumu::Result_t::~Result_t((Result_t *)&tmp_obj);
            }
            else {
              fputs("File does not contain HMAC values, ignoring -m option.\n",_stderr);
            }
            ASDCP::WriterInfo::~WriterInfo(&Info);
          }
        }
      }
      goto LAB_00109293;
    }
    if (uVar9 <= uVar8) {
      if (uVar9 + uVar8 < uVar8) {
        uVar8 = uVar9 + uVar8;
      }
      goto LAB_001090bf;
    }
    fwrite("Start value greater than file duration.\n",0x28,1,_stderr);
    local_310 = (Result_t *)&Kumu::RESULT_FAIL;
  }
  Kumu::Result_t::Result_t((Result_t *)Options,local_310);
LAB_00109516:
  Kumu::Result_t::~Result_t(&result);
  WavFileWriter::~WavFileWriter(&OutWave);
  ASDCP::FrameBuffer::~FrameBuffer(&FrameBuffer.super_FrameBuffer);
  AS_02::PCM::MXFReader::~MXFReader(&Reader);
  return Options;
}

Assistant:

Result_t
read_PCM_file(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
  AESDecContext*     Context = 0;
  HMACContext*       HMAC = 0;
  AS_02::PCM::MXFReader     Reader(fileReaderFactory);
  PCM::FrameBuffer   FrameBuffer;
  WavFileWriter      OutWave;
  ui32_t last_frame = 0;
  ASDCP::MXF::WaveAudioDescriptor *wave_descriptor = 0;

  if ( Options.edit_rate == ASDCP::Rational(0,0) ) // todo, make this available to the CLI
    {
      Options.edit_rate = EditRate_24;
    }

  Result_t result = Reader.OpenRead(Options.input_filename, Options.edit_rate);

  if ( KM_SUCCESS(result) )
    {
      if ( Options.verbose_flag )
	{
	  fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
	}
      
      ASDCP::MXF::InterchangeObject* tmp_obj = 0;

      result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_WaveAudioDescriptor), &tmp_obj);

      if ( KM_SUCCESS(result) )
	{
	  wave_descriptor = dynamic_cast<ASDCP::MXF::WaveAudioDescriptor*>(tmp_obj);

	  if ( wave_descriptor == 0 )
	    {
	      fprintf(stderr, "File does not contain an essence descriptor.\n");
	      return RESULT_FAIL;
	    }
      
	  if ( Options.verbose_flag )
	    {
	      wave_descriptor->Dump();
	    }

	  if ( wave_descriptor->ContainerDuration.get() == 0 )
	    {
	      fprintf(stderr, "ContainerDuration not set in file descriptor, attempting to use index duration.\n");
	      last_frame = Reader.AS02IndexReader().GetDuration();
	    }
	  else
	    {
              if ( ! wave_descriptor->ContainerDuration.empty() )
                {
	          last_frame = (ui32_t)wave_descriptor->ContainerDuration;
                }
	    }

	  if ( last_frame == 0 )
	    {
	      fprintf(stderr, "ContainerDuration not set in index, attempting to use Duration from SourceClip.\n");
	      result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_SourceClip), &tmp_obj);
	      if ( KM_SUCCESS(result))
		{
	    	  ASDCP::MXF::SourceClip *sourceClip = dynamic_cast<ASDCP::MXF::SourceClip*>(tmp_obj);
	    	  if ( ! sourceClip->Duration.empty() )
		    {
		      last_frame = (ui32_t)sourceClip->Duration;
		    }
		}
	    }

	  if ( last_frame == 0 )
	    {
	      fprintf(stderr, "Unable to determine file duration.\n");
	      return RESULT_FAIL;
	    }

	  assert(wave_descriptor);
	  FrameBuffer.Capacity(AS_02::MXF::CalcFrameBufferSize(*wave_descriptor, Options.edit_rate));
	  last_frame = AS_02::MXF::CalcFramesFromDurationInSamples(last_frame, *wave_descriptor, Options.edit_rate);
	}
    }

  if ( ASDCP_SUCCESS(result) )
    {
      if ( Options.duration > 0 && Options.duration < last_frame )
	last_frame = Options.duration;

      if ( Options.start_frame > 0 )
	{
	  if ( Options.start_frame > last_frame )
	    {
	      fprintf(stderr, "Start value greater than file duration.\n");
	      return RESULT_FAIL;
	    }

	  last_frame = Kumu::xmin(Options.start_frame + last_frame, last_frame);
	}

      last_frame = last_frame - Options.start_frame;

      PCM::AudioDescriptor ADesc;

      result = MD_to_PCM_ADesc(wave_descriptor, ADesc);

      if ( ASDCP_SUCCESS(result) )
	{
	  ADesc.ContainerDuration = last_frame;
	  ADesc.EditRate = Options.edit_rate;

	  result = OutWave.OpenWrite(ADesc, Options.file_prefix,
				     ( Options.split_wav ? WavFileWriter::ST_STEREO : 
				       ( Options.mono_wav ? WavFileWriter::ST_MONO : WavFileWriter::ST_NONE ) ));
	}
    }

#ifdef HAVE_OPENSSL
  if ( ASDCP_SUCCESS(result) && Options.key_flag )
    {
      Context = new AESDecContext;
      result = Context->InitKey(Options.key_value);

      if ( ASDCP_SUCCESS(result) && Options.read_hmac )
	{
	  WriterInfo Info;
	  Reader.FillWriterInfo(Info);

	  if ( Info.UsesHMAC )
	    {
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	  else
	    {
	      fputs("File does not contain HMAC values, ignoring -m option.\n", stderr);
	    }
	}
    }
#endif // HAVE_OPENSSL

  for ( ui32_t i = Options.start_frame; ASDCP_SUCCESS(result) && i < last_frame; i++ )
    {
      result = Reader.ReadFrame(i, FrameBuffer, Context, HMAC);

      if ( ASDCP_SUCCESS(result) )
	{
	  if ( Options.verbose_flag )
	    {
	      FrameBuffer.FrameNumber(i);
	      FrameBuffer.Dump(stderr, Options.fb_dump_size);
	    }

	  if ( FrameBuffer.Size() != FrameBuffer.Capacity() )
	    {
	      fprintf(stderr, "Last frame is incomplete, padding with zeros.\n");
	      // actually, it has already been zeroed for us, we just need to recognize the appropriate size
	      FrameBuffer.Size(FrameBuffer.Capacity());
	    }

	  result = OutWave.WriteFrame(FrameBuffer);
	}
    }

  return result;
}